

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O0

int pt_evt_fetch_packet(pt_event_decoder *decoder)

{
  int iVar1;
  int status;
  pt_event_decoder *decoder_local;
  
  if (decoder == (pt_event_decoder *)0x0) {
    decoder_local._4_4_ = -1;
  }
  else {
    do {
      iVar1 = pt_pkt_next(&decoder->pacdec,&decoder->packet,0x18);
      if (iVar1 < 0) {
        (decoder->packet).type = ppt_invalid;
        (decoder->packet).size = '\0';
        decoder->status = iVar1;
        break;
      }
    } while ((decoder->packet).type == ppt_pad);
    decoder_local._4_4_ = 0;
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_evt_fetch_packet(struct pt_event_decoder *decoder)
{
	int status;

	if (!decoder)
		return -pte_internal;

	/* Skip PAD packets right here.
	 *
	 * This isn't strictly necessary but it gives more useful offsets.
	 */
	do {
		status = pt_pkt_next(&decoder->pacdec, &decoder->packet,
				     sizeof(decoder->packet));
		if (status < 0) {
			/* Store any error to be delivered later. */
			decoder->packet.type = ppt_invalid;
			decoder->packet.size = 0;
			decoder->status = status;

			break;
		}
	} while (decoder->packet.type == ppt_pad);

	return 0;
}